

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall
Js::FunctionBody::MapLoopHeadersUntil<Js::FunctionBody::DoRedeferFunction(unsigned_int)const::__1>
          (FunctionBody *this)

{
  bool bVar1;
  uint uVar2;
  LoopHeader *pLVar3;
  uint local_28;
  uint i;
  uint loopCount;
  LoopHeader *loopHeaderArray;
  FunctionBody *this_local;
  
  pLVar3 = GetLoopHeaderArray(this);
  if (pLVar3 != (LoopHeader *)0x0) {
    uVar2 = GetLoopCount(this);
    for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
      bVar1 = DoRedeferFunction::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&this_local + 6),local_28,
                         pLVar3 + local_28);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool MapLoopHeadersUntil(Fn fn) const
        {
            Js::LoopHeader* loopHeaderArray = this->GetLoopHeaderArray();
            if (loopHeaderArray)
            {
                uint loopCount = this->GetLoopCount();
                for (uint i = 0; i < loopCount; i++)
                {
                    if (fn(i, &loopHeaderArray[i]))
                    {
                        return true;
                    }
                }
                return false;
            }
            return false;
        }